

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  byte type2;
  ushort uVar2;
  int iVar3;
  uint16_t *puVar4;
  container_t *c2;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *c;
  undefined4 extraout_var;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  uint8_t uVar12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint8_t result_type;
  uint8_t local_69 [15];
  ushort local_5a;
  ulong local_58;
  int local_4c;
  ulong local_48;
  int *local_40;
  roaring_bitmap_t *local_38;
  
  if (x1 != x2) {
    iVar3 = (x1->high_low_container).size;
    iVar7 = (x2->high_low_container).size;
    local_58 = 0;
    uVar8 = 0;
    if (0 < iVar7 && 0 < iVar3) {
      uVar8 = 0;
      uVar15 = 0;
      local_58 = 0;
      local_4c = iVar7;
      local_38 = x2;
      do {
        uVar9 = (uint)uVar8 & 0xffff;
        uVar2 = (x1->high_low_container).keys[uVar9];
        puVar4 = (x2->high_low_container).keys;
        uVar14 = (uint)uVar15;
        uVar11 = uVar14 & 0xffff;
        uVar13 = puVar4[uVar11];
        if (uVar2 == uVar13) {
          bVar1 = (x1->high_low_container).typecodes[uVar9];
          local_40 = (int *)(x1->high_low_container).containers[uVar9];
          type2 = (x2->high_low_container).typecodes[uVar11];
          c2 = (x2->high_low_container).containers[uVar11];
          local_5a = uVar2;
          local_48 = uVar8;
          if (bVar1 != 4) {
            if (type2 == 4) {
              type2 = *(byte *)((long)c2 + 8);
            }
            local_69[1] = '\0';
            local_69[2] = '\0';
            local_69[3] = '\0';
            local_69[4] = '\0';
            local_69[5] = '\0';
            local_69[6] = '\0';
            local_69[7] = '\0';
            local_69[8] = '\0';
            (*(code *)(&DAT_0012c85c +
                      *(int *)(&DAT_0012c85c + (ulong)(((uint)type2 + (uint)bVar1 * 4) - 5) * 4)))()
            ;
            return;
          }
          c = (int *)container_and(local_40,'\x04',c2,type2,local_69);
          if (c != local_40) {
            container_free(local_40,'\x04');
          }
          iVar7 = local_4c;
          piVar10 = c;
          uVar12 = local_69[0];
          if (local_69[0] == '\x04') {
            uVar12 = (uint8_t)c[2];
            piVar10 = *(int **)c;
          }
          iVar17 = *piVar10;
          iVar6 = (int)local_48;
          if ((uVar12 == '\x03') || (uVar12 == '\x02')) {
            if (iVar17 < 1) goto LAB_0010efbe;
LAB_0010efd1:
            iVar17 = (int)local_58;
            (x1->high_low_container).keys[iVar17] = local_5a;
            (x1->high_low_container).containers[iVar17] = c;
            (x1->high_low_container).typecodes[iVar17] = local_69[0];
            local_58 = (ulong)(iVar17 + 1);
          }
          else {
            if (iVar17 != 0) {
              if (iVar17 != -1) goto LAB_0010efd1;
              lVar16 = 0;
              do {
                if (*(long *)(*(long *)(piVar10 + 2) + lVar16 * 8) != 0) goto LAB_0010efd1;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0x400);
            }
LAB_0010efbe:
            container_free(c,local_69[0]);
            iVar6 = (int)local_48;
          }
          uVar8 = (ulong)(iVar6 + 1);
          uVar15 = (ulong)(uVar14 + 1);
          x2 = local_38;
        }
        else if (uVar2 < uVar13) {
          iVar5 = ra_advance_until_freeing(&x1->high_low_container,uVar13,(uint)uVar8);
          uVar8 = CONCAT44(extraout_var,iVar5);
        }
        else {
          uVar9 = (x2->high_low_container).size;
          uVar11 = uVar14 + 1;
          if (((int)uVar11 < (int)uVar9) && (puVar4[(int)uVar11] < uVar2)) {
            uVar14 = uVar14 + 2;
            iVar17 = 1;
            if ((int)uVar14 < (int)uVar9) {
              iVar17 = 1;
              do {
                uVar15 = (ulong)uVar14;
                uVar13 = puVar4[(int)uVar14];
                if (uVar2 <= uVar13) goto LAB_0010ee44;
                iVar6 = iVar17 * 2;
                uVar14 = uVar11 + iVar17 * 2;
                iVar17 = iVar6;
              } while ((int)uVar14 < (int)uVar9);
            }
            uVar13 = puVar4[(long)(int)uVar9 + -1];
            uVar15 = (long)(int)uVar9 - 1;
LAB_0010ee44:
            if (uVar13 != uVar2) {
              if (uVar13 < uVar2) {
                uVar15 = (ulong)uVar9;
              }
              else if ((iVar17 >> 1) + uVar11 + 1 != (int)uVar15) {
                uVar11 = (iVar17 >> 1) + uVar11;
                do {
                  uVar14 = (int)(uVar11 + (int)uVar15) >> 1;
                  if (puVar4[(int)uVar14] == uVar2) {
                    uVar15 = (ulong)uVar14;
                    break;
                  }
                  if (uVar2 <= puVar4[(int)uVar14]) {
                    uVar15 = (ulong)uVar14;
                    uVar14 = uVar11;
                  }
                  uVar11 = uVar14;
                } while (uVar11 + 1 != (int)uVar15);
              }
            }
          }
          else {
            uVar15 = (ulong)uVar11;
          }
        }
      } while (((int)uVar8 < iVar3) && ((int)uVar15 < iVar7));
    }
    iVar7 = (int)uVar8;
    iVar17 = iVar3 - iVar7;
    if (iVar17 != 0 && iVar7 <= iVar3) {
      lVar16 = (long)iVar7;
      do {
        container_free((x1->high_low_container).containers[lVar16],
                       (x1->high_low_container).typecodes[lVar16]);
        lVar16 = lVar16 + 1;
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
    ra_downsize(&x1->high_low_container,(int32_t)local_58);
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}